

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udata.cpp
# Opt level: O2

void __thiscall
icu_63::UDataPathIterator::UDataPathIterator
          (UDataPathIterator *this,char *inPath,char *pkg,char *item,char *inSuffix,
          UBool doCheckLastFour,UErrorCode *pErrorCode)

{
  CharString *this_00;
  char *__s;
  size_t sVar1;
  UDataPathIterator *pUVar2;
  CharString *this_01;
  StringPiece local_58;
  CharString *local_48;
  StringPiece local_40;
  
  (this->suffix).ptr_ = (char *)0x0;
  (this->suffix).length_ = 0;
  this_01 = &this->itemPath;
  MaybeStackArray<char,_40>::MaybeStackArray(&this_01->buffer);
  (this->itemPath).len = 0;
  *(this->itemPath).buffer.ptr = '\0';
  local_48 = &this->pathBuffer;
  MaybeStackArray<char,_40>::MaybeStackArray(&local_48->buffer);
  (this->pathBuffer).len = 0;
  *(this->pathBuffer).buffer.ptr = '\0';
  MaybeStackArray<char,_40>::MaybeStackArray(&(this->packageStub).buffer);
  (this->packageStub).len = 0;
  *(this->packageStub).buffer.ptr = '\0';
  if (inPath == (char *)0x0) {
    inPath = u_getDataDirectory_63();
  }
  this->path = inPath;
  if (pkg != (char *)0x0) {
    this_00 = CharString::append(&this->packageStub,'/',pErrorCode);
    StringPiece::StringPiece(&local_40,pkg);
    CharString::append(this_00,local_40.ptr_,local_40.length_,pErrorCode);
  }
  __s = findBasename(item);
  this->basename = __s;
  sVar1 = strlen(__s);
  this->basenameLen = (uint32_t)sVar1;
  pUVar2 = this;
  if (__s != item) {
    CharString::append(this_01,item,(int)__s - (int)item,pErrorCode);
    pUVar2 = (UDataPathIterator *)this_01;
  }
  this->nextPath = pUVar2->path;
  if (inSuffix == (char *)0x0) {
    StringPiece::StringPiece(&local_58,"");
  }
  else {
    StringPiece::StringPiece(&local_58,inSuffix);
  }
  (this->suffix).length_ = local_58.length_;
  (this->suffix).ptr_ = local_58.ptr_;
  this->checkLastFour = doCheckLastFour;
  return;
}

Assistant:

UDataPathIterator::UDataPathIterator(const char *inPath, const char *pkg,
                                     const char *item, const char *inSuffix, UBool doCheckLastFour,
                                     UErrorCode *pErrorCode)
{
#ifdef UDATA_DEBUG
        fprintf(stderr, "SUFFIX1=%s PATH=%s\n", inSuffix, inPath);
#endif
    /** Path **/
    if(inPath == NULL) {
        path = u_getDataDirectory();
    } else {
        path = inPath;
    }

    /** Package **/
    if(pkg != NULL) {
      packageStub.append(U_FILE_SEP_CHAR, *pErrorCode).append(pkg, *pErrorCode);
#ifdef UDATA_DEBUG
      fprintf(stderr, "STUB=%s [%d]\n", packageStub.data(), packageStub.length());
#endif
    }

    /** Item **/
    basename = findBasename(item);
    basenameLen = (int32_t)uprv_strlen(basename);

    /** Item path **/
    if(basename == item) {
        nextPath = path;
    } else {
        itemPath.append(item, (int32_t)(basename-item), *pErrorCode);
        nextPath = itemPath.data();
    }
#ifdef UDATA_DEBUG
    fprintf(stderr, "SUFFIX=%s [%p]\n", inSuffix, inSuffix);
#endif

    /** Suffix  **/
    if(inSuffix != NULL) {
        suffix = inSuffix;
    } else {
        suffix = "";
    }

    checkLastFour = doCheckLastFour;

    /* pathBuffer will hold the output path strings returned by this iterator */

#ifdef UDATA_DEBUG
    fprintf(stderr, "%p: init %s -> [path=%s], [base=%s], [suff=%s], [itempath=%s], [nextpath=%s], [checklast4=%s]\n",
            iter,
            item,
            path,
            basename,
            suffix,
            itemPath.data(),
            nextPath,
            checkLastFour?"TRUE":"false");
#endif
}